

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

size_t sum_count_dfs(log_multi *b,node *node)

{
  node *node_00;
  size_t sVar1;
  log_multi *in_RSI;
  long in_RDI;
  node *in_stack_ffffffffffffffe0;
  ulong local_8;
  
  if ((in_RSI->max_predictors & 0x100000000) == 0) {
    local_8 = (ulong)(uint)in_RSI->max_predictors;
  }
  else {
    v_array<node>::operator[]
              ((v_array<node> *)(in_RDI + 8),(ulong)*(uint *)((long)&in_RSI->predictors_used + 4));
    node_00 = (node *)sum_count_dfs(in_RSI,in_stack_ffffffffffffffe0);
    v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*(uint *)&in_RSI->progress);
    sVar1 = sum_count_dfs(in_RSI,node_00);
    local_8 = (long)&node_00->parent + sVar1;
  }
  return local_8;
}

Assistant:

size_t sum_count_dfs(log_multi& b, const node& node)
{
  if (node.internal)
    return sum_count_dfs(b, b.nodes[node.left]) + sum_count_dfs(b, b.nodes[node.right]);
  else
    return node.min_count;
}